

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_verifyObjLimitReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  bool bVar1;
  type_conflict5 tVar2;
  Verbosity VVar3;
  element_type *peVar4;
  long in_RDI;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  bool dualfeasible;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  redcostviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  dualviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumviol;
  Verbosity old_verbosity;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffd88;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd90;
  longlong in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  type_conflict5 tVar5;
  Verbosity local_250;
  Verbosity local_24c [41];
  Verbosity local_1a8;
  Verbosity local_1a4;
  Real local_1a0;
  Real local_198;
  byte local_18d;
  undefined4 local_18c;
  undefined4 local_138;
  undefined4 local_e4;
  Verbosity local_90;
  Verbosity local_8c;
  undefined8 interrupt;
  undefined1 applySimplifier;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined8 in_stack_ffffffffffffffc8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffffd0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffd8;
  
  if ((in_RDI != -8) && (VVar3 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar3)) {
    local_8c = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
    local_90 = INFO1;
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&stack0xffffffffffffff70);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffd90,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffd88);
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&stack0xffffffffffffff74);
  }
  local_e4 = 0;
  this_00 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)&stack0xffffffffffffff20;
  applySimplifier = (undefined1)((ulong)&local_e4 >> 0x38);
  interrupt = (bool *)0x0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),in_stack_fffffffffffffd98
             ,in_stack_fffffffffffffd90);
  local_138 = 0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),in_stack_fffffffffffffd98
             ,in_stack_fffffffffffffd90);
  local_18c = 0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),in_stack_fffffffffffffd98
             ,in_stack_fffffffffffffd90);
  local_18d = 1;
  bVar1 = getDualViolation(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffffc8);
  if (!bVar1) {
    local_18d = 0;
  }
  bVar1 = getRedCostViolation(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)in_stack_ffffffffffffffc8);
  if (!bVar1) {
    local_18d = 0;
  }
  tVar5 = true;
  if ((local_18d & 1) != 0) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)(in_RDI + 0x180));
    peVar4 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x61859f);
    local_198 = Tolerances::floatingPointOpttol(peVar4);
    tVar2 = boost::multiprecision::operator>=
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffd88,(double *)0x6185c5);
    tVar5 = true;
    if (!tVar2) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::tolerances((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)(in_RDI + 0x180));
      peVar4 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x6185eb);
      local_1a0 = Tolerances::floatingPointOpttol(peVar4);
      tVar5 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffd88,(double *)0x618611);
    }
  }
  if (tVar5 != false) {
    if ((in_RDI != -8) && (VVar3 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 4 < (int)VVar3)) {
      local_1a4 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
      local_1a8 = INFO3;
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_1a8);
      in_stack_fffffffffffffd90 =
           (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)soplex::operator<<((SPxOut *)in_stack_fffffffffffffd90,
                                 (char *)in_stack_fffffffffffffd88);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffd90,
                 in_stack_fffffffffffffd88);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd90,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffd88);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffd90,
                 in_stack_fffffffffffffd88);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd90,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffd88);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd90,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffd88);
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_1a4);
    }
    if ((in_RDI != -8) && (VVar3 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar3)) {
      local_24c[0] = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
      local_250 = INFO1;
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_250);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd90,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffd88);
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_24c);
    }
    if ((*(long *)(in_RDI + 0x3078) == 0) && (*(long *)(in_RDI + 0x3070) == 0)) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::toggleTerminationValue
                ((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)(in_RDI + 0x180),false);
    }
    else if ((*(byte *)(in_RDI + 0x5701) & 1) != 0) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::unscaleLPandReloadBasis(in_stack_fffffffffffffd90);
      *(undefined1 *)(in_RDI + 0x5701) = 0;
      *(int *)(in_RDI + 0x64d8) = *(int *)(in_RDI + 0x64d8) + 1;
    }
    _preprocessAndSolveReal(this_00,(bool)applySimplifier,(bool *)interrupt);
  }
  return;
}

Assistant:

void SoPlexBase<R>::_verifyObjLimitReal()
{
   SPX_MSG_INFO1(spxout, spxout << " --- verifying objective limit" << std::endl;)

   R sumviol = 0;
   R dualviol = 0;
   R redcostviol = 0;

   bool dualfeasible = true;

   if(!getDualViolation(dualviol, sumviol))
      dualfeasible = false;

   if(!getRedCostViolation(redcostviol, sumviol))
      dualfeasible = false;

   if(!dualfeasible || dualviol >= _solver.tolerances()->floatingPointOpttol()
         || redcostviol >= _solver.tolerances()->floatingPointOpttol())
   {
      assert(&_solver == _realLP);
      assert(_isRealLPLoaded);
      SPX_MSG_INFO3(spxout, spxout << ", dual violation: " << dualviol
                    << ", redcost violation: " << redcostviol << std::endl;)
      SPX_MSG_INFO1(spxout, spxout <<
                    " --- detected violations in original problem space -- solve again without presolving/scaling" <<
                    std::endl;)

      // if we already disabled simplifier and scaler, next disable the objective limit
      if(_scaler == nullptr && _simplifier == nullptr)
      {
         _solver.toggleTerminationValue(false);
      }
      else if(_isRealLPScaled)
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }

      _preprocessAndSolveReal(false);
   }
}